

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

Buffer xmrig::Buffer::fromHex(char *data,size_t size)

{
  undefined1 uVar1;
  ulong in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  long in_RSI;
  Buffer *in_RDI;
  Buffer BVar3;
  Buffer buf;
  size_t in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  Buffer *this;
  Buffer *in_stack_ffffffffffffffa0;
  Buffer local_28 [2];
  
  if ((in_RSI == 0) || ((in_RDX & 1) != 0)) {
    memset(in_RDI,0,0x10);
    Buffer(in_RDI);
    sVar2 = extraout_RDX;
  }
  else {
    this = local_28;
    Buffer(in_stack_ffffffffffffffa0,(size_t)this);
    Buffer::data(this);
    uVar1 = fromHex((char *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff88,(char *)0x1d6037);
    if ((bool)uVar1) {
      Buffer(in_RDI,local_28);
    }
    else {
      memset(in_RDI,0,0x10);
      Buffer(in_RDI);
    }
    ~Buffer((Buffer *)CONCAT17(uVar1,in_stack_ffffffffffffff90));
    sVar2 = extraout_RDX_00;
  }
  BVar3.m_size = sVar2;
  BVar3.m_data = (char *)in_RDI;
  return BVar3;
}

Assistant:

xmrig::Buffer xmrig::Buffer::fromHex(const char *data, size_t size)
{
    if (data == nullptr || size % 2 != 0) {
        return {};
    }

    Buffer buf(size / 2);
    if (!fromHex(data, size, buf.data())) {
        return {};
    }

    return buf;
}